

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O1

void __thiscall
Rml::ScrollController::UpdateAutoscroll
          (ScrollController *this,Vector2i mouse_position,float dp_ratio)

{
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  SystemInterface *pSVar4;
  undefined4 extraout_XMM0_Da;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar6;
  Vector2f scroll_length_integral;
  Vector2f local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_48._8_8_ = local_48._0_8_;
  local_38._0_4_ = dp_ratio;
  if ((this->mode != Autoscroll) || (this->target == (Element *)0x0)) {
    bVar3 = Assert("RMLUI_ASSERT(mode == Mode::Autoscroll && target)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                   ,0x8a);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  local_48._0_8_ = this->previous_update_time;
  pSVar4 = GetSystemInterface();
  (*pSVar4->_vptr_SystemInterface[2])(pSVar4);
  this->previous_update_time = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  fVar6 = (float)((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - (double)local_48._0_8_);
  fVar5 = 0.06666667;
  if (fVar6 <= 0.06666667) {
    fVar5 = fVar6;
  }
  local_48 = ZEXT416(-(uint)(fVar6 < 0.002) & 0x3b03126f | ~-(uint)(fVar6 < 0.002) & (uint)fVar5);
  VVar2.y = (float)(mouse_position.y - (this->autoscroll_start_position).y);
  VVar2.x = (float)(mouse_position.x - (this->autoscroll_start_position).x);
  VVar2 = CalculateAutoscrollVelocity(VVar2,(float)local_38._0_4_);
  local_28 = VVar2.y;
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_4_ = VVar2.x;
  local_38._4_4_ = VVar2.y;
  local_38._12_4_ = extraout_XMM0_Dd;
  (this->autoscroll_accumulated_length).x =
       VVar2.x * (float)local_48._0_4_ + (this->autoscroll_accumulated_length).x;
  (this->autoscroll_accumulated_length).y =
       (float)local_48._0_4_ * local_28 + (this->autoscroll_accumulated_length).y;
  local_50 = this->autoscroll_accumulated_length;
  fStack_24 = local_28;
  fStack_20 = local_28;
  fStack_1c = local_28;
  fVar5 = Math::DecomposeFractionalIntegral((this->autoscroll_accumulated_length).x,&local_50.x);
  (this->autoscroll_accumulated_length).x = fVar5;
  fVar5 = Math::DecomposeFractionalIntegral((this->autoscroll_accumulated_length).y,&local_50.y);
  (this->autoscroll_accumulated_length).y = fVar5;
  if (((((float)local_38._0_4_ != 0.0) || (NAN((float)local_38._0_4_))) || (local_28 != 0.0)) ||
     (NAN(local_28))) {
    this->autoscroll_moved = true;
  }
  PerformScrollOnTarget(this,local_50);
  return;
}

Assistant:

void ScrollController::UpdateAutoscroll(Vector2i mouse_position, float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Autoscroll && target);

	const float dt = UpdateTime();

	const Vector2f scroll_delta = Vector2f(mouse_position - autoscroll_start_position);
	const Vector2f scroll_velocity = CalculateAutoscrollVelocity(scroll_delta, dp_ratio);

	autoscroll_accumulated_length += scroll_velocity * dt;

	// Only submit the integer part of the scroll length, accumulate and store fractional parts to enable sub-pixel-per-frame scrolling speeds.
	Vector2f scroll_length_integral = autoscroll_accumulated_length;
	autoscroll_accumulated_length.x = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.x, &scroll_length_integral.x);
	autoscroll_accumulated_length.y = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.y, &scroll_length_integral.y);

	if (scroll_velocity != Vector2f(0.f))
		autoscroll_moved = true;

	PerformScrollOnTarget(scroll_length_integral);
}